

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TDeletingArray<FRandom_*,_FRandom_*>::~TDeletingArray(TDeletingArray<FRandom_*,_FRandom_*> *this)

{
  FRandom *this_00;
  uint i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < (this->super_TArray<FRandom_*,_FRandom_*>).Count; uVar1 = uVar1 + 1) {
    this_00 = (this->super_TArray<FRandom_*,_FRandom_*>).Array[uVar1];
    if (this_00 != (FRandom *)0x0) {
      FRandom::~FRandom(this_00);
      operator_delete(this_00,0x70);
    }
  }
  TArray<FRandom_*,_FRandom_*>::~TArray(&this->super_TArray<FRandom_*,_FRandom_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}